

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handle.cpp
# Opt level: O0

string * __thiscall remote::Handle::GetPath_abi_cxx11_(string *__return_storage_ptr__,Handle *this)

{
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Handle *local_18;
  Handle *this_local;
  
  local_18 = this;
  this_local = (Handle *)__return_storage_ptr__;
  GetProcDirectory_abi_cxx11_(&local_58,this);
  std::operator+(&local_38,&local_58,"/exe");
  FileSystem::ResolveSymLink(__return_storage_ptr__,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

string Handle::GetPath() {
    return FileSystem::ResolveSymLink(GetProcDirectory() + "/exe");
}